

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i2p_tests.cpp
# Opt level: O2

void __thiscall
EnvTestingSetup::EnvTestingSetup(EnvTestingSetup *this,ChainType chainType,TestOpts opts)

{
  long lVar1;
  Logger *pLVar2;
  TestOpts *in_RDX;
  long in_FS_OFFSET;
  TestOpts in_stack_ffffffffffffffb8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  TestOpts::TestOpts((TestOpts *)&stack0xffffffffffffffb8,in_RDX);
  BasicTestingSetup::BasicTestingSetup
            (&this->super_BasicTestingSetup,chainType,in_stack_ffffffffffffffb8);
  std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
            ((_Vector_base<const_char_*,_std::allocator<const_char_*>_> *)&stack0xffffffffffffffb8);
  pLVar2 = LogInstance();
  this->m_prev_log_level = (pLVar2->m_log_level)._M_i;
  std::function<std::unique_ptr<Sock,_std::default_delete<Sock>_>_(int,_int,_int)>::function
            (&this->m_create_sock_orig,&CreateSock);
  pLVar2 = LogInstance();
  LOCK();
  (pLVar2->m_log_level)._M_i = Trace;
  UNLOCK();
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

explicit EnvTestingSetup(const ChainType chainType = ChainType::MAIN,
                             TestOpts opts = {})
        : BasicTestingSetup{chainType, opts},
          m_prev_log_level{LogInstance().LogLevel()},
          m_create_sock_orig{CreateSock}
    {
        LogInstance().SetLogLevel(BCLog::Level::Trace);
    }